

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sskdf.c
# Opt level: O0

size_t sskdf_size(KDF_SSKDF *ctx)

{
  int iVar1;
  EVP_MD *func;
  char *in_RDI;
  EVP_MD *md;
  int len;
  EVP_MD *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffec;
  size_t local_8;
  
  func = ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 0x10));
  if (func == (EVP_MD *)0x0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_stack_ffffffffffffffec,(char *)func);
    ERR_set_error(0x39,0x81,(char *)0x0);
    local_8 = 0;
  }
  else {
    iVar1 = EVP_MD_get_size(in_stack_ffffffffffffffd8);
    if (iVar1 < 1) {
      local_8 = 0;
    }
    else {
      local_8 = (size_t)iVar1;
    }
  }
  return local_8;
}

Assistant:

static size_t sskdf_size(KDF_SSKDF *ctx)
{
    int len;
    const EVP_MD *md = ossl_prov_digest_md(&ctx->digest);

    if (md == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_MESSAGE_DIGEST);
        return 0;
    }
    len = EVP_MD_get_size(md);
    return (len <= 0) ? 0 : (size_t)len;
}